

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

int Bbl_ManCheck(Bbl_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  Vec_Str_t *pVVar5;
  int iVar6;
  
  pVVar5 = p->pObjs;
  if (pVVar5->nSize < 1) {
    iVar6 = 1;
  }
  else {
    uVar4 = 0;
    iVar6 = 1;
    do {
      pcVar2 = pVVar5->pArray;
      if (pcVar2 == (char *)0x0) {
        return iVar6;
      }
      uVar3 = *(uint *)(pcVar2 + (ulong)uVar4 + 8);
      if (((uVar3 & 3) == 0) && (*(int *)(pcVar2 + (ulong)uVar4 + 4) == -1)) {
        iVar6 = 0;
        printf("Bbl_ManCheck(): Node %d does not have function specified.\n",
               (ulong)*(uint *)(pcVar2 + uVar4));
        uVar3 = *(uint *)(pcVar2 + (ulong)uVar4 + 8);
      }
      if (((uVar3 & 1) != 0) && (*(int *)(pcVar2 + (ulong)uVar4 + 4) != -1)) {
        iVar6 = 0;
        printf("Bbl_ManCheck(): CI with %d has function specified.\n",
               (ulong)*(uint *)(pcVar2 + uVar4));
        uVar3 = *(uint *)(pcVar2 + (ulong)uVar4 + 8);
      }
      if (((uVar3 & 2) != 0) && (*(int *)(pcVar2 + (ulong)uVar4 + 4) != -1)) {
        iVar6 = 0;
        printf("Bbl_ManCheck(): CO with %d has function specified.\n",
               (ulong)*(uint *)(pcVar2 + uVar4));
      }
      iVar1 = *(int *)(pcVar2 + uVar4);
      if (((long)iVar1 < 0) || (p->vFaninNums->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/bbl/bblif.c"
                      ,0x10e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = *(uint *)(pcVar2 + (ulong)uVar4 + 8);
      if (p->vFaninNums->pArray[iVar1] != uVar3 >> 4) {
        iVar6 = 0;
        printf("Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n");
        uVar3 = *(uint *)(pcVar2 + (ulong)uVar4 + 8);
      }
      uVar4 = uVar4 + (uVar3 >> 4) * 4 + 0xc;
      pVVar5 = p->pObjs;
    } while ((int)uVar4 < pVVar5->nSize);
  }
  return iVar6;
}

Assistant:

int Bbl_ManCheck( Bbl_Man_t * p )
{
    Bbl_Obj_t * pObj;
    int h, RetValue = 1;
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        if ( Bbl_ObjIsNode(pObj) && pObj->Fnc == -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): Node %d does not have function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCi(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CI with %d has function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCo(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CO with %d has function specified.\n", pObj->Id );
        if ( Vec_IntEntry(p->vFaninNums, pObj->Id) != (int)pObj->nFanins )
            RetValue = 0, printf( "Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n", 
                pObj->Id, Vec_IntEntry(p->vFaninNums, pObj->Id), pObj->nFanins );
    }
    return RetValue;
}